

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_31::WebSocketImpl::sendImpl
          (WebSocketImpl *this,byte opcode,ArrayPtr<const_unsigned_char> message)

{
  code *pcVar1;
  _func_int *p_Var2;
  _func_int ***ppp_Var3;
  _func_int ***ppp_Var4;
  uchar *puVar5;
  size_t sVar6;
  WebSocket WVar7;
  TransformPromiseNodeBase *pTVar8;
  ChainPromiseNode *pCVar9;
  ChainPromiseNode *extraout_RDX;
  ChainPromiseNode *extraout_RDX_00;
  PromiseNode *pPVar10;
  ChainPromiseNode *extraout_RDX_01;
  ChainPromiseNode *extraout_RDX_02;
  ChainPromiseNode *extraout_RDX_03;
  undefined7 in_register_00000031;
  _func_int **pp_Var11;
  Mask mask_00;
  PromiseNode *in_R8;
  Disposer *pDVar12;
  bool fin;
  PromiseNode *pPVar13;
  Own<kj::_::ChainPromiseNode> OVar14;
  ArrayPtr<const_unsigned_char> AVar15;
  Promise<void> PVar16;
  Mask mask;
  Promise<void> promise;
  Array<unsigned_char> ownMessage;
  undefined4 local_8c;
  Array<unsigned_char> local_88;
  WebSocket local_68;
  Disposer *pDStack_60;
  ArrayDisposer *local_58;
  WebSocketImpl *local_50;
  Promise<void> local_48;
  PromiseNode *local_38;
  
  pp_Var11 = (_func_int **)CONCAT71(in_register_00000031,opcode);
  local_38 = (PromiseNode *)message.size_;
  local_50 = this;
  if (*(char *)((long)pp_Var11 + 0x21) == '\x01') {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
              ((Fault *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x968,FAILED,"!disconnected","\"WebSocket can\'t send after disconnect()\"",
               (char (*) [40])"WebSocket can\'t send after disconnect()");
    _::Debug::Fault::fatal((Fault *)&local_68);
  }
  if (*(char *)((long)pp_Var11 + 0x22) == '\x01') {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
              ((Fault *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x969,FAILED,"!currentlySending","\"another message send is already in progress\"",
               (char (*) [44])"another message send is already in progress");
    _::Debug::Fault::fatal((Fault *)&local_68);
  }
  *(undefined1 *)((long)pp_Var11 + 0x22) = 1;
  fin = message.ptr._0_1_;
  if (*(char *)(pp_Var11 + 0xf) == '\x01') {
    pTVar8 = (TransformPromiseNodeBase *)operator_new(0x48);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar8,(Own<kj::_::PromiseNode> *)(pp_Var11 + 0x10),
               _::
               TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2415:30),_kj::_::PropagateException>
               ::anon_class_32_3_f7a759be_for_func::operator());
    (pTVar8->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045f6b8;
    pTVar8[1].super_PromiseNode._vptr_PromiseNode = pp_Var11;
    *(bool *)&pTVar8[1].dependency.disposer = fin;
    pTVar8[1].dependency.ptr = local_38;
    pTVar8[1].continuationTracePtr = in_R8;
    local_88.ptr = (uchar *)&_::
                             HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::WebSocketImpl::sendImpl(unsigned_char,kj::ArrayPtr<unsigned_char_const>)::{lambda()#1},kj::_::PropagateException>>
                             ::instance;
    local_88.size_ = (size_t)pTVar8;
    OVar14 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
                       ((kj *)&local_68,(Own<kj::_::PromiseNode> *)&local_88);
    pCVar9 = OVar14.ptr;
    (local_50->super_WebSocket)._vptr_WebSocket = local_68._vptr_WebSocket;
    (local_50->stream).disposer = pDStack_60;
    if ((TransformPromiseNodeBase *)local_88.size_ != (TransformPromiseNodeBase *)0x0) {
      local_88.size_ = 0;
      (*(code *)**(undefined8 **)local_88.ptr)();
      pCVar9 = extraout_RDX;
    }
    if ((*(char *)(pp_Var11 + 0xf) == '\x01') &&
       (*(undefined1 *)(pp_Var11 + 0xf) = 0, pp_Var11[0x11] != (_func_int *)0x0)) {
      pp_Var11[0x11] = (_func_int *)0x0;
      (*(code *)**(undefined8 **)pp_Var11[0x10])();
      pCVar9 = extraout_RDX_00;
    }
  }
  else {
    mask_00.maskBytes = SUB84(in_R8,0);
    *(byte *)(pp_Var11 + 4) = *(byte *)(pp_Var11 + 4) | fin == true;
    p_Var2 = pp_Var11[3];
    if (p_Var2 == (_func_int *)0x0) {
      local_8c = 0;
    }
    else {
      (*(code *)**(undefined8 **)p_Var2)(p_Var2,&local_8c,4);
    }
    pPVar13 = local_38;
    local_68._vptr_WebSocket = (_func_int **)0x0;
    pDStack_60 = (Disposer *)0x0;
    local_58 = (ArrayDisposer *)0x0;
    if (((local_8c._1_1_ != '\0' || (char)local_8c != '\0') || local_8c._2_1_ != '\0') ||
        local_8c._3_1_ != '\0') {
      mask_00.maskBytes[0] = '\0';
      mask_00.maskBytes[1] = '\0';
      mask_00.maskBytes[2] = '\0';
      mask_00.maskBytes[3] = '\0';
      local_88.ptr = (uchar *)_::HeapArrayDisposer::allocateImpl
                                        (1,0,(size_t)in_R8,(_func_void_void_ptr *)0x0,
                                         (_func_void_void_ptr *)0x0);
      pPVar10 = (PromiseNode *)local_88.ptr;
      if (in_R8 != (PromiseNode *)0x0) {
        pPVar10 = (PromiseNode *)
                  ((long)&((PromiseNode *)local_88.ptr)->_vptr_PromiseNode +
                  (long)&(in_R8 + -10)[10]._vptr_PromiseNode);
        memcpy(local_88.ptr,pPVar13,(size_t)in_R8);
      }
      pDVar12 = pDStack_60;
      WVar7._vptr_WebSocket = local_68._vptr_WebSocket;
      local_88.size_ = (size_t)((long)pPVar10 - (long)local_88.ptr);
      local_88.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      if ((PromiseNode *)local_68._vptr_WebSocket != (PromiseNode *)0x0) {
        local_68._vptr_WebSocket = (_func_int **)0x0;
        pDStack_60 = (Disposer *)0x0;
        (**local_58->_vptr_ArrayDisposer)(local_58,WVar7._vptr_WebSocket,1,pDVar12,pDVar12,0);
        mask_00.maskBytes = SUB84(pDVar12,0);
      }
      local_68._vptr_WebSocket = (_func_int **)local_88.ptr;
      pDStack_60 = (Disposer *)local_88.size_;
      local_58 = local_88.disposer;
      pPVar13 = (PromiseNode *)local_88.ptr;
      in_R8 = (PromiseNode *)local_88.size_;
      if ((PromiseNode *)local_88.size_ != (PromiseNode *)0x0) {
        pPVar10 = (PromiseNode *)0x0;
        do {
          pcVar1 = (code *)((long)(_func_int ***)local_88.ptr +
                           (long)&(pPVar10 + -10)[10]._vptr_PromiseNode);
          *pcVar1 = (code)((byte)*pcVar1 ^ *(byte *)((long)&local_8c + (ulong)((uint)pPVar10 & 3)));
          pPVar10 = (PromiseNode *)((long)&pPVar10->_vptr_PromiseNode + 1);
        } while ((PromiseNode *)local_88.size_ != pPVar10);
      }
    }
    AVar15 = Header::compose((Header *)((long)pp_Var11 + 0x23),fin,(byte)in_R8,(ulong)local_8c,
                             mask_00);
    *(ArrayPtr<const_unsigned_char> *)(pp_Var11 + 7) = AVar15;
    pp_Var11[9] = (_func_int *)pPVar13;
    pp_Var11[10] = (_func_int *)in_R8;
    (**(code **)(*(long *)(pp_Var11[2] + 8) + 8))(&local_88,pp_Var11[2] + 8,pp_Var11 + 7,2);
    if (((local_8c._1_1_ != '\0' || (char)local_8c != '\0') || local_8c._2_1_ != '\0') ||
        local_8c._3_1_ != '\0') {
      PVar16 = Promise<void>::attach<kj::Array<unsigned_char>>(&local_48,&local_88);
      puVar5 = local_88.ptr;
      local_88.ptr = (uchar *)CONCAT44(local_48.super_PromiseBase.node.disposer._4_4_,
                                       local_48.super_PromiseBase.node.disposer._0_4_);
      pPVar13 = local_48.super_PromiseBase.node.ptr;
      local_48.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      if ((PromiseNode *)local_88.size_ != (PromiseNode *)0x0) {
        ppp_Var3 = (_func_int ***)local_88.size_;
        ppp_Var4 = (_func_int ***)local_88.size_;
        local_88.size_ = (size_t)pPVar13;
        (***(_func_int ***)puVar5)
                  (puVar5,(*ppp_Var3)[-2] + (long)ppp_Var4,PVar16.super_PromiseBase.node.ptr);
        pPVar13 = (PromiseNode *)local_88.size_;
      }
      local_88.size_ = (size_t)pPVar13;
      pPVar13 = local_48.super_PromiseBase.node.ptr;
      if (local_48.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
        local_48.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        (*(code *)**(undefined8 **)
                    CONCAT44(local_48.super_PromiseBase.node.disposer._4_4_,
                             local_48.super_PromiseBase.node.disposer._0_4_))
                  ((undefined8 *)
                   CONCAT44(local_48.super_PromiseBase.node.disposer._4_4_,
                            local_48.super_PromiseBase.node.disposer._0_4_),
                   pPVar13->_vptr_PromiseNode[-2] + (long)&pPVar13->_vptr_PromiseNode);
      }
    }
    pTVar8 = (TransformPromiseNodeBase *)operator_new(0x30);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar8,(Own<kj::_::PromiseNode> *)&local_88,
               _::
               TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2445:25),_kj::_::PropagateException>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    sVar6 = local_88.size_;
    (pTVar8->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045f740;
    pTVar8[1].super_PromiseNode._vptr_PromiseNode = pp_Var11;
    (local_50->super_WebSocket)._vptr_WebSocket =
         (_func_int **)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::WebSocketImpl::sendImpl(unsigned_char,kj::ArrayPtr<unsigned_char_const>)::{lambda()#2},kj::_::PropagateException>>
          ::instance;
    (local_50->stream).disposer = (Disposer *)pTVar8;
    pCVar9 = extraout_RDX_01;
    if ((PromiseNode *)local_88.size_ != (PromiseNode *)0x0) {
      local_88.size_ = 0;
      (***(_func_int ***)local_88.ptr)
                (local_88.ptr,(*(_func_int ***)sVar6)[-2] + (long)(_func_int ***)sVar6);
      pCVar9 = extraout_RDX_02;
    }
    pDVar12 = pDStack_60;
    WVar7._vptr_WebSocket = local_68._vptr_WebSocket;
    if ((PromiseNode *)local_68._vptr_WebSocket != (PromiseNode *)0x0) {
      local_68._vptr_WebSocket = (_func_int **)0x0;
      pDStack_60 = (Disposer *)0x0;
      (**local_58->_vptr_ArrayDisposer)(local_58,WVar7._vptr_WebSocket,1,pDVar12,pDVar12,0);
      pCVar9 = extraout_RDX_03;
    }
  }
  PVar16.super_PromiseBase.node.ptr = &pCVar9->super_PromiseNode;
  PVar16.super_PromiseBase.node.disposer = (Disposer *)local_50;
  return (Promise<void>)PVar16.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> sendImpl(byte opcode, kj::ArrayPtr<const byte> message) {
    KJ_REQUIRE(!disconnected, "WebSocket can't send after disconnect()");
    KJ_REQUIRE(!currentlySending, "another message send is already in progress");

    currentlySending = true;

    KJ_IF_MAYBE(p, sendingPong) {
      // We recently sent a pong, make sure it's finished before proceeding.
      auto promise = p->then([this, opcode, message]() {
        currentlySending = false;
        return sendImpl(opcode, message);
      });
      sendingPong = nullptr;
      return promise;
    }

    // We don't stop the application from sending further messages after close() -- this is the
    // application's error to make. But, we do want to make sure we don't send any PONGs after a
    // close, since that would be our error. So we stack whether we closed for that reason.
    hasSentClose = hasSentClose || opcode == OPCODE_CLOSE;

    Mask mask(maskKeyGenerator);

    kj::Array<byte> ownMessage;
    if (!mask.isZero()) {
      // Sadness, we have to make a copy to apply the mask.
      ownMessage = kj::heapArray(message);
      mask.apply(ownMessage);
      message = ownMessage;
    }

    sendParts[0] = sendHeader.compose(true, opcode, message.size(), mask);
    sendParts[1] = message;

    auto promise = stream->write(sendParts);
    if (!mask.isZero()) {
      promise = promise.attach(kj::mv(ownMessage));
    }
    return promise.then([this]() {
      currentlySending = false;

      // Send queued pong if needed.
      KJ_IF_MAYBE(q, queuedPong) {
        kj::Array<byte> payload = kj::mv(*q);
        queuedPong = nullptr;
        queuePong(kj::mv(payload));
      }
    });
  }